

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::(anonymous_namespace)::ValidateSymbolForDeclaration_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,string_view symbol)

{
  bool bVar1;
  char *pcVar2;
  char *p;
  AlphaNum *in_R8;
  string_view text;
  string_view prefix;
  string_view name;
  string sStack_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  string_view local_58 [3];
  char *extraout_RDX;
  
  pcVar2 = (char *)symbol._M_len;
  text._M_str = pcVar2;
  text._M_len = (size_t)this;
  prefix._M_str = ".";
  prefix._M_len = 1;
  bVar1 = absl::lts_20250127::StartsWith(text,prefix);
  if (bVar1) {
    name._M_str = extraout_RDX;
    name._M_len = (size_t)pcVar2;
    bVar1 = ValidateQualifiedName((protobuf *)this,name);
    if (bVar1) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
    local_58[0] = absl::lts_20250127::NullSafeStringView("\"");
    p = "\" contains invalid identifiers.";
  }
  else {
    local_58[0] = absl::lts_20250127::NullSafeStringView("\"");
    p = "\" must have a leading dot to indicate the fully-qualified scope.";
  }
  local_88.piece_._M_len = (size_t)this;
  local_88.piece_._M_str = pcVar2;
  local_b8.piece_ = absl::lts_20250127::NullSafeStringView(p);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&sStack_d8,(lts_20250127 *)local_58,&local_88,&local_b8,in_R8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&sStack_d8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  return __return_storage_ptr__;
}

Assistant:

absl::optional<std::string> ValidateSymbolForDeclaration(
    absl::string_view symbol) {
  if (!absl::StartsWith(symbol, ".")) {
    return absl::StrCat("\"", symbol,
                        "\" must have a leading dot to indicate the "
                        "fully-qualified scope.");
  }
  if (!ValidateQualifiedName(symbol)) {
    return absl::StrCat("\"", symbol, "\" contains invalid identifiers.");
  }
  return absl::nullopt;
}